

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  _xmlSAXHandler *p_Var3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  cdataBlockSAXFunc p_Var9;
  int iVar10;
  uint uVar11;
  xmlChar *pxVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int l;
  int sl;
  int rl;
  int local_64;
  xmlChar *local_60;
  int local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pxVar2 = ctxt->input;
  pxVar12 = pxVar2->cur;
  if (ctxt->mlType == XML_TYPE_XML) {
    if (*pxVar12 != '<') {
      return;
    }
    if (pxVar12[1] != '!') {
      return;
    }
    if (pxVar12[2] != '[') {
      return;
    }
    if (pxVar12[3] != 'C') {
      return;
    }
    if (pxVar12[4] != 'D') {
      return;
    }
    if (pxVar12[5] != 'A') {
      return;
    }
    if (pxVar12[6] != 'T') {
      return;
    }
    if (pxVar12[7] != 'A') {
      return;
    }
    if (pxVar12[8] != '[') {
      return;
    }
    pxVar2->cur = pxVar12 + 9;
    pxVar2->col = pxVar2->col + 9;
    xVar1 = pxVar12[9];
  }
  else {
    if (*pxVar12 != '<') {
      return;
    }
    if (pxVar12[1] != '[') {
      return;
    }
    if (pxVar12[2] != '[') {
      return;
    }
    pxVar2->cur = pxVar12 + 3;
    pxVar2->col = pxVar2->col + 3;
    xVar1 = pxVar12[3];
  }
  if (xVar1 == '\0') {
    xmlParserInputGrow(pxVar2,0xfa);
  }
  ctxt->instate = XML_PARSER_CDATA_SECTION;
  uVar5 = xmlCurrentChar(ctxt,&local_50);
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < 0x100) {
    if (((int)uVar5 < 0x20) && ((0xd < uVar5 || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0))))
    goto LAB_001664ea;
  }
  else if ((0xfffff < uVar5 - 0x10000 && 0x1ffd < uVar5 - 0xe000) && 0xd7ff < (int)uVar5)
  goto LAB_001664ea;
  pxVar2 = ctxt->input;
  if (*pxVar2->cur == '\n') {
    pxVar2->line = pxVar2->line + 1;
    pxVar2->col = 1;
  }
  else {
    pxVar2->col = pxVar2->col + 1;
  }
  pxVar2->cur = pxVar2->cur + local_50;
  uVar5 = xmlCurrentChar(ctxt,&local_54);
  if ((int)uVar5 < 0x100) {
    if ((0x1f < (int)uVar5) || ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
LAB_0016649f:
      pxVar2 = ctxt->input;
      if (*pxVar2->cur == '\n') {
        pxVar2->line = pxVar2->line + 1;
        pxVar2->col = 1;
      }
      else {
        pxVar2->col = pxVar2->col + 1;
      }
      pxVar2->cur = pxVar2->cur + local_54;
      uVar6 = xmlCurrentChar(ctxt,&local_64);
      local_60 = (xmlChar *)(*xmlMallocAtomic)(100);
      if (local_60 == (xmlChar *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        return;
      }
      iVar15 = 100;
      uVar14 = 0;
      local_4c = 0;
      while( true ) {
        uVar11 = uVar6;
        pxVar12 = local_60;
        uVar16 = (ulong)uVar5;
        iVar10 = (int)uVar14;
        if ((int)uVar11 < 0x100) break;
        if ((0xfffff < uVar11 - 0x10000 && 0x1ffd < uVar11 - 0xe000) && 0xd7ff < (int)uVar11)
        goto LAB_00166747;
LAB_001665ac:
        if (uVar11 == 0x3e && (uVar5 == 0x5d && (int)uVar13 == 0x5d)) goto LAB_00166747;
        if (iVar15 <= iVar10 + 5) {
          local_48 = uVar14;
          local_40 = uVar13;
          local_38 = uVar16;
          if ((iVar15 < 0x989681) || ((ctxt->options & 0x80000) != 0)) {
            pxVar8 = (xmlChar *)(*xmlRealloc)(local_60,(long)(iVar15 * 2));
            if (pxVar8 == (xmlChar *)0x0) {
              (*xmlFree)(pxVar12);
              bVar4 = false;
              xmlErrMemory(ctxt,(char *)0x0);
            }
            else {
              bVar4 = true;
              pxVar12 = pxVar8;
              iVar15 = iVar15 * 2;
            }
          }
          else {
            bVar4 = false;
            xmlFatalErrMsgStr(ctxt,XML_ERR_CDATA_NOT_FINISHED,"CData section too big found",
                              (xmlChar *)0x0);
            (*xmlFree)(pxVar12);
          }
          uVar13 = local_40;
          uVar14 = local_48;
          uVar16 = local_38;
          local_60 = pxVar12;
          if (!bVar4) {
            return;
          }
        }
        iVar10 = (int)uVar14;
        if (local_50 == 1) {
          uVar5 = iVar10 + 1;
          local_60[iVar10] = (xmlChar)uVar13;
        }
        else {
          iVar7 = xmlCopyCharMultiByte(local_60 + iVar10,(int)uVar13);
          uVar5 = iVar7 + iVar10;
        }
        uVar14 = (ulong)uVar5;
        local_50 = local_54;
        local_54 = local_64;
        if (local_4c < 0x32) {
          iVar10 = local_4c + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar10 = 0;
          pxVar12 = local_60;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_001667ef;
        }
        pxVar2 = ctxt->input;
        if (*pxVar2->cur == '\n') {
          pxVar2->line = pxVar2->line + 1;
          pxVar2->col = 1;
        }
        else {
          pxVar2->col = pxVar2->col + 1;
        }
        pxVar2->cur = pxVar2->cur + local_64;
        local_4c = iVar10;
        uVar6 = xmlCurrentChar(ctxt,&local_64);
        uVar13 = uVar16 & 0xffffffff;
        uVar5 = uVar11;
      }
      if ((0x1f < (int)uVar11) || ((uVar11 < 0xe && ((0x2600U >> (uVar11 & 0x1f) & 1) != 0))))
      goto LAB_001665ac;
LAB_00166747:
      local_60[iVar10] = '\0';
      ctxt->instate = XML_PARSER_CONTENT;
      if (uVar11 == 0x3e) {
        pxVar2 = ctxt->input;
        if (*pxVar2->cur == '\n') {
          pxVar2->line = pxVar2->line + 1;
          pxVar2->col = 1;
        }
        else {
          pxVar2->col = pxVar2->col + 1;
        }
        pxVar2->cur = pxVar2->cur + local_64;
        p_Var3 = ctxt->sax;
        if (((p_Var3 != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           ((p_Var9 = p_Var3->cdataBlock, p_Var9 != (cdataBlockSAXFunc)0x0 ||
            (p_Var9 = p_Var3->characters, p_Var9 != (cdataBlockSAXFunc)0x0)))) {
          (*p_Var9)(ctxt->userData,local_60,iVar10);
        }
      }
      else {
        xmlFatalErrMsgStr(ctxt,XML_ERR_CDATA_NOT_FINISHED,"CData section not finished\n%.50s\n",
                          local_60);
      }
LAB_001667ef:
      (*xmlFree)(pxVar12);
      return;
    }
  }
  else if ((uVar5 - 0x10000 < 0x100000 || uVar5 - 0xe000 < 0x1ffe) || (int)uVar5 < 0xd800)
  goto LAB_0016649f;
LAB_001664ea:
  xmlFatalErr(ctxt,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
  return;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int count = 0;

    DEBUG_ENTER(("xmlParseCDSect(%s);\n", dbgCtxt(ctxt)));

    /* Check 2.6.0 was NXT(0) not RAW */
    if (ISXML) {						/* XML*/
      if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	  SKIP(9);
      } else
	  RETURN();
    } else {							/* SML */
      if (CMP3(CUR_PTR, '<', '[', '[')) {
	  SKIP(3);
      } else
	  RETURN();
    }

    ctxt->instate = XML_PARSER_CDATA_SECTION;
    r = CUR_CHAR(rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
	ctxt->instate = XML_PARSER_CONTENT;
        RETURN();
    }
    NEXTL(rl);
    s = CUR_CHAR(sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
	ctxt->instate = XML_PARSER_CONTENT;
        RETURN();
    }
    NEXTL(sl);
    cur = CUR_CHAR(l);
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	RETURN();
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                             "CData section too big found", NULL);
                xmlFree (buf);
                RETURN();
            }
	    tmp = (xmlChar *) xmlRealloc(buf, size * 2 * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		RETURN();
	    }
	    buf = tmp;
	    size *= 2;
	}
	COPY_BUF(rl,buf,len,r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	count++;
	if (count > 50) {
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		RETURN();
            }
	    count = 0;
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
    }
    buf[len] = 0;
    ctxt->instate = XML_PARSER_CONTENT;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
	xmlFree(buf);
        RETURN();
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
	if (ctxt->sax->cdataBlock != NULL)
	    ctxt->sax->cdataBlock(ctxt->userData, buf, len);
	else if (ctxt->sax->characters != NULL)
	    ctxt->sax->characters(ctxt->userData, buf, len);
    }
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseCDSect. ctxt = %s;\n", dbgCtxt(ctxt)));
}